

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aialgorithm.cpp
# Opt level: O0

void __thiscall Test_aialgorithm_countOf_Test::TestBody(Test_aialgorithm_countOf_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_2108;
  Message local_2100;
  int local_20f4;
  size_t local_20f0;
  undefined1 local_20e8 [8];
  AssertionResult gtest_ar_4;
  A buf5 [123];
  size_t val4;
  Message local_1910;
  int local_1904;
  size_t local_1900;
  undefined1 local_18f8 [8];
  AssertionResult gtest_ar_3;
  int buf4 [1234];
  AssertHelper local_598;
  Message local_590;
  int local_584;
  size_t local_580;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_2;
  char buf3 [1234];
  Message local_88;
  int local_7c;
  size_t local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_1;
  int buf2 [1];
  Message local_50 [3];
  int local_34;
  size_t local_30;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  char buf1 [1];
  Test_aialgorithm_countOf_Test *this_local;
  
  local_30 = ai::countOf<char,1ul>((char (*) [1])((long)&gtest_ar.message_.ptr_ + 7));
  local_34 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            ((EqHelper<false> *)local_28,"ai::countOf(buf1)","1",&local_30,&local_34);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)buf2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
               ,0x1e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)buf2,local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)buf2);
    testing::Message::~Message(local_50);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_78 = ai::countOf<int,1ul>((int (*) [1])&gtest_ar_1.message_);
    local_7c = 1;
    testing::internal::EqHelper<false>::Compare<unsigned_long,int>
              ((EqHelper<false> *)local_70,"ai::countOf(buf2)","1",&local_78,&local_7c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar1) {
      testing::Message::Message(&local_88);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(buf3 + 0x4d0),kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                 ,0x20,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)(buf3 + 0x4d0),&local_88);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(buf3 + 0x4d0));
      testing::Message::~Message(&local_88);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_580 = ai::countOf<char,1234ul>((char (*) [1234])&gtest_ar_2.message_);
      local_584 = 0x4d2;
      testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                ((EqHelper<false> *)local_578,"ai::countOf(buf3)","1234",&local_580,&local_584);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
      if (!bVar1) {
        testing::Message::Message(&local_590);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
        testing::internal::AssertHelper::AssertHelper
                  (&local_598,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                   ,0x22,pcVar2);
        testing::internal::AssertHelper::operator=(&local_598,&local_590);
        testing::internal::AssertHelper::~AssertHelper(&local_598);
        testing::Message::~Message(&local_590);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_1900 = ai::countOf<int,1234ul>((int (*) [1234])&gtest_ar_3.message_);
        local_1904 = 0x4d2;
        testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                  ((EqHelper<false> *)local_18f8,"ai::countOf(buf4)","1234",&local_1900,&local_1904)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18f8);
        if (!bVar1) {
          testing::Message::Message(&local_1910);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&val4,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                     ,0x24,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&val4,&local_1910);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&val4);
          testing::Message::~Message(&local_1910);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_18f8);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          local_20f0 = ai::countOf<Test_aialgorithm_countOf_Test::TestBody()::A,123ul>
                                 ((A (*) [123])&gtest_ar_4.message_);
          local_20f4 = 0x7b;
          testing::internal::EqHelper<false>::Compare<unsigned_long,int>
                    ((EqHelper<false> *)local_20e8,"ai::countOf(buf5)","123",&local_20f0,&local_20f4
                    );
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20e8);
          if (!bVar1) {
            testing::Message::Message(&local_2100);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20e8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2108,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                       ,0x2e,pcVar2);
            testing::internal::AssertHelper::operator=(&local_2108,&local_2100);
            testing::internal::AssertHelper::~AssertHelper(&local_2108);
            testing::Message::~Message(&local_2100);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_20e8);
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(Test_aialgorithm, countOf)
{
    char buf1[1];
    ASSERT_EQ(ai::countOf(buf1), 1);
    int buf2[1];
    ASSERT_EQ(ai::countOf(buf2), 1);
    char buf3[1234];
    ASSERT_EQ(ai::countOf(buf3), 1234);
    int buf4[1234];
    ASSERT_EQ(ai::countOf(buf4), 1234);
    constexpr auto val4 = ai::countOf(buf4);
    static_assert(val4 == 1234, "");

    struct A
    {
        int    a;
        double f;
    };
    A buf5[123];
    ASSERT_EQ(ai::countOf(buf5), 123);
}